

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

void Bfree(Bigint *v)

{
  ulong uVar1;
  malloc_tree_chunk *pmVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  malloc_tree_chunk **ppmVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  malloc_tree_chunk *pmVar10;
  long lVar11;
  byte bVar12;
  uint uVar13;
  tbinptr pmVar14;
  tbinptr pmVar15;
  tbinptr pmVar16;
  tbinptr pmVar17;
  mstate m;
  tbinptr pmVar18;
  malloc_tree_chunk **ppmVar19;
  size_t __len;
  bool bVar20;
  
  if (v == (Bigint *)0x0) {
    return;
  }
  lVar11 = (long)v->k;
  if (lVar11 < 8) {
    v->next = TI0.Freelist[lVar11];
    TI0.Freelist[lVar11] = v;
    return;
  }
  if (v == (Bigint *)0x0) {
    return;
  }
  pmVar16 = (tbinptr)&v[-1].sign;
  if (((byte)_gm_.mflags & 2) != 0) {
    LOCK();
    UNLOCK();
    bVar20 = _gm_.mutex != 0;
    _gm_.mutex = 1;
    if (bVar20) {
      spin_acquire_lock(&_gm_.mutex);
    }
  }
  if ((pmVar16 < _gm_.least_addr) || (uVar9 = *(ulong *)v[-1].x, ((uint)uVar9 & 3) == 1))
  goto LAB_0010c0f9;
  sVar8 = uVar9 & 0xfffffffffffffff8;
  pmVar15 = (tbinptr)((long)pmVar16 + sVar8);
  if ((uVar9 & 1) != 0) goto LAB_0010bc7b;
  uVar1 = *(ulong *)pmVar16;
  if ((uVar9 & 2) == 0) {
    __len = sVar8 + uVar1 + 0x20;
    iVar7 = munmap((void *)((long)pmVar16 - uVar1),__len);
    sVar8 = _gm_.dvsize;
    if (iVar7 == 0) {
      _gm_.footprint = _gm_.footprint - __len;
    }
    goto LAB_0010c0d1;
  }
  pmVar16 = (tbinptr)((long)pmVar16 - uVar1);
  if (pmVar16 < _gm_.least_addr) goto LAB_0010c0f9;
  sVar8 = sVar8 + uVar1;
  if (pmVar16 == (tbinptr)_gm_.dv) {
    if ((~(uint)pmVar15->head & 3) == 0) {
      _gm_.dvsize = sVar8;
      pmVar15->head = pmVar15->head & 0xfffffffffffffffe;
      pmVar16->head = sVar8 | 1;
      pmVar15->prev_foot = sVar8;
      sVar8 = _gm_.dvsize;
      goto LAB_0010c0d1;
    }
  }
  else if (uVar1 < 0x100) {
    pmVar10 = pmVar16->fd;
    pmVar2 = pmVar16->bk;
    if ((pmVar10 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar1 >> 3) * 2)) &&
       ((pmVar10 < _gm_.least_addr || (pmVar10->bk != pmVar16)))) goto LAB_0010c0f9;
    if (pmVar2 == pmVar10) {
      bVar12 = (byte)(uVar1 >> 3) & 0x1f;
      _gm_.smallmap = _gm_.smallmap & (-2 << bVar12 | 0xfffffffeU >> 0x20 - bVar12);
    }
    else {
      if ((pmVar2 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar1 >> 3) * 2)) &&
         ((pmVar2 < _gm_.least_addr || (pmVar2->fd != pmVar16)))) goto LAB_0010c0f9;
      pmVar10->bk = pmVar2;
      pmVar2->fd = pmVar10;
    }
  }
  else {
    pmVar17 = pmVar16->bk;
    pmVar10 = pmVar16->child[2];
    if (pmVar17 == pmVar16) {
      if (pmVar16->child[1] == (tbinptr)0x0) {
        if (pmVar16->child[0] == (tbinptr)0x0) {
          pmVar17 = (tbinptr)0x0;
          goto LAB_0010bbdb;
        }
        pmVar14 = pmVar16->child[0];
        ppmVar6 = pmVar16->child;
      }
      else {
        pmVar14 = pmVar16->child[1];
        ppmVar6 = pmVar16->child + 1;
      }
      do {
        do {
          ppmVar19 = ppmVar6;
          pmVar17 = pmVar14;
          pmVar14 = pmVar17->child[1];
          ppmVar6 = pmVar17->child + 1;
        } while (pmVar17->child[1] != (malloc_tree_chunk *)0x0);
        pmVar14 = pmVar17->child[0];
        ppmVar6 = pmVar17->child;
      } while (pmVar17->child[0] != (malloc_tree_chunk *)0x0);
      if (ppmVar19 < _gm_.least_addr) goto LAB_0010c0f9;
      *ppmVar19 = (malloc_tree_chunk *)0x0;
    }
    else {
      pmVar2 = pmVar16->fd;
      if (((pmVar2 < _gm_.least_addr) || (pmVar2->bk != pmVar16)) || (pmVar17->fd != pmVar16))
      goto LAB_0010c0f9;
      pmVar2->bk = pmVar17;
      pmVar17->fd = pmVar2;
    }
LAB_0010bbdb:
    if (pmVar10 != (malloc_tree_chunk *)0x0) {
      uVar13 = *(uint *)(pmVar16->child + 3);
      if (pmVar16 == _gm_.treebins[uVar13]) {
        _gm_.treebins[uVar13] = pmVar17;
        if (pmVar17 == (tbinptr)0x0) {
          bVar12 = (byte)uVar13 & 0x1f;
          _gm_.treemap = _gm_.treemap & (-2 << bVar12 | 0xfffffffeU >> 0x20 - bVar12);
        }
        else {
LAB_0010bc27:
          pcVar5 = _gm_.least_addr;
          if (pmVar17 < _gm_.least_addr) goto LAB_0010c0f9;
          pmVar17->child[2] = pmVar10;
          pmVar10 = pmVar16->child[0];
          if (pmVar10 != (malloc_tree_chunk *)0x0) {
            if (pmVar10 < pcVar5) goto LAB_0010c0f9;
            pmVar17->child[0] = pmVar10;
            pmVar10->parent = pmVar17;
          }
          pmVar10 = pmVar16->child[1];
          if (pmVar10 != (malloc_tree_chunk *)0x0) {
            if (pmVar10 < pcVar5) goto LAB_0010c0f9;
            pmVar17->child[1] = pmVar10;
            pmVar10->parent = pmVar17;
          }
        }
      }
      else {
        if (pmVar10 < _gm_.least_addr) goto LAB_0010c0f9;
        pmVar10->child[pmVar10->child[0] != pmVar16] = pmVar17;
        if (pmVar17 != (tbinptr)0x0) goto LAB_0010bc27;
      }
    }
  }
LAB_0010bc7b:
  if ((pmVar15 <= pmVar16) || (uVar9 = pmVar15->head, (uVar9 & 1) == 0)) goto LAB_0010c0f9;
  if ((uVar9 & 2) == 0) {
    if (pmVar15 == (tbinptr)_gm_.top) {
      uVar9 = sVar8 + _gm_.topsize;
      _gm_.topsize = uVar9;
      _gm_.top = (mchunkptr)pmVar16;
      pmVar16->head = uVar9 | 1;
      if (pmVar16 == (tbinptr)_gm_.dv) {
        _gm_.dv = (mchunkptr)0x0;
        _gm_.dvsize = 0;
      }
      sVar8 = _gm_.dvsize;
      if (_gm_.trim_check < uVar9) {
        sys_trim((mstate)0x0,0xfffffffffffffffe);
        sVar8 = _gm_.dvsize;
      }
      goto LAB_0010c0d1;
    }
    if (pmVar15 == (tbinptr)_gm_.dv) {
      uVar9 = sVar8 + _gm_.dvsize;
      _gm_.dvsize = uVar9;
      _gm_.dv = (mchunkptr)pmVar16;
      pmVar16->head = uVar9 | 1;
      *(ulong *)((long)&pmVar16->prev_foot + uVar9) = uVar9;
      sVar8 = _gm_.dvsize;
      goto LAB_0010c0d1;
    }
    if (uVar9 < 0x100) {
      pmVar10 = pmVar15->fd;
      pmVar2 = pmVar15->bk;
      if ((pmVar10 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar9 >> 3) * 2)) &&
         ((pmVar10 < _gm_.least_addr || (pmVar10->bk != pmVar15)))) goto LAB_0010c0f9;
      if (pmVar2 == pmVar10) {
        bVar12 = (byte)(uVar9 >> 3) & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar12 | 0xfffffffeU >> 0x20 - bVar12);
      }
      else {
        if ((pmVar2 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar9 >> 3) * 2)) &&
           ((pmVar2 < _gm_.least_addr || (pmVar2->fd != pmVar15)))) goto LAB_0010c0f9;
        pmVar10->bk = pmVar2;
        pmVar2->fd = pmVar10;
      }
    }
    else {
      pmVar17 = pmVar15->bk;
      pmVar10 = pmVar15->child[2];
      if (pmVar17 == pmVar15) {
        if (pmVar15->child[1] == (tbinptr)0x0) {
          if (pmVar15->child[0] == (tbinptr)0x0) {
            pmVar17 = (tbinptr)0x0;
            goto LAB_0010c011;
          }
          pmVar14 = pmVar15->child[0];
          ppmVar6 = pmVar15->child;
        }
        else {
          pmVar14 = pmVar15->child[1];
          ppmVar6 = pmVar15->child + 1;
        }
        do {
          do {
            ppmVar19 = ppmVar6;
            pmVar17 = pmVar14;
            pmVar14 = pmVar17->child[1];
            ppmVar6 = pmVar17->child + 1;
          } while (pmVar17->child[1] != (malloc_tree_chunk *)0x0);
          pmVar14 = pmVar17->child[0];
          ppmVar6 = pmVar17->child;
        } while (pmVar17->child[0] != (malloc_tree_chunk *)0x0);
        if (ppmVar19 < _gm_.least_addr) goto LAB_0010c0f9;
        *ppmVar19 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar2 = pmVar15->fd;
        if (((pmVar2 < _gm_.least_addr) || (pmVar2->bk != pmVar15)) || (pmVar17->fd != pmVar15))
        goto LAB_0010c0f9;
        pmVar2->bk = pmVar17;
        pmVar17->fd = pmVar2;
      }
LAB_0010c011:
      if (pmVar10 != (malloc_tree_chunk *)0x0) {
        uVar13 = *(uint *)(pmVar15->child + 3);
        if (pmVar15 == _gm_.treebins[uVar13]) {
          _gm_.treebins[uVar13] = pmVar17;
          if (pmVar17 == (tbinptr)0x0) {
            bVar12 = (byte)uVar13 & 0x1f;
            _gm_.treemap = _gm_.treemap & (-2 << bVar12 | 0xfffffffeU >> 0x20 - bVar12);
          }
          else {
LAB_0010c05d:
            pcVar5 = _gm_.least_addr;
            if (pmVar17 < _gm_.least_addr) goto LAB_0010c0f9;
            pmVar17->child[2] = pmVar10;
            pmVar10 = pmVar15->child[0];
            if (pmVar10 != (malloc_tree_chunk *)0x0) {
              if (pmVar10 < pcVar5) goto LAB_0010c0f9;
              pmVar17->child[0] = pmVar10;
              pmVar10->parent = pmVar17;
            }
            pmVar10 = pmVar15->child[1];
            if (pmVar10 != (malloc_tree_chunk *)0x0) {
              if (pmVar10 < pcVar5) goto LAB_0010c0f9;
              pmVar17->child[1] = pmVar10;
              pmVar10->parent = pmVar17;
            }
          }
        }
        else {
          if (pmVar10 < _gm_.least_addr) goto LAB_0010c0f9;
          pmVar10->child[pmVar10->child[0] != pmVar15] = pmVar17;
          if (pmVar17 != (tbinptr)0x0) goto LAB_0010c05d;
        }
      }
    }
    sVar8 = sVar8 + (uVar9 & 0xfffffffffffffff8);
    pmVar16->head = sVar8 | 1;
    *(size_t *)((long)&pmVar16->prev_foot + sVar8) = sVar8;
    if (pmVar16 == (tbinptr)_gm_.dv) goto LAB_0010c0d1;
  }
  else {
    pmVar15->head = uVar9 & 0xfffffffffffffffe;
    pmVar16->head = sVar8 | 1;
    *(size_t *)((long)&pmVar16->prev_foot + sVar8) = sVar8;
  }
  if (sVar8 < 0x100) {
    uVar9 = sVar8 >> 3;
    if ((_gm_.smallmap >> ((uint)uVar9 & 0x1f) & 1) == 0) {
      _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar9 & 0x1f);
      pmVar10 = (malloc_tree_chunk *)(_gm_.smallbins + uVar9 * 2);
    }
    else {
      pmVar10 = (malloc_tree_chunk *)_gm_.smallbins[uVar9 * 2 + 2];
      if ((malloc_tree_chunk *)_gm_.smallbins[uVar9 * 2 + 2] < _gm_.least_addr) {
LAB_0010c0f9:
        abort();
      }
    }
    _gm_.smallbins[uVar9 * 2 + 2] = (mchunkptr)pmVar16;
    pmVar10->bk = pmVar16;
    pmVar16->fd = pmVar10;
    pmVar16->bk = (malloc_tree_chunk *)(_gm_.smallbins + uVar9 * 2);
    sVar8 = _gm_.dvsize;
  }
  else {
    uVar13 = (uint)(sVar8 >> 8);
    if (uVar13 == 0) {
      uVar13 = 0;
    }
    else if (uVar13 < 0x10000) {
      uVar3 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar13 = (uint)((sVar8 >> ((ulong)(byte)(0x26 - (char)(uVar3 ^ 0x1f)) & 0x3f) & 1) != 0) +
               (uVar3 ^ 0x1f) * 2 ^ 0x3e;
    }
    else {
      uVar13 = 0x1f;
    }
    pmVar15 = (tbinptr)(_gm_.treebins + uVar13);
    *(uint *)(pmVar16->child + 3) = uVar13;
    pmVar16->child[0] = (malloc_tree_chunk *)0x0;
    pmVar16->child[1] = (malloc_tree_chunk *)0x0;
    if ((_gm_.treemap >> (uVar13 & 0x1f) & 1) == 0) {
      _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar13 & 0x1f);
      pmVar17 = pmVar15;
    }
    else {
      bVar12 = 0x39 - (char)(uVar13 >> 1);
      if (uVar13 == 0x1f) {
        bVar12 = 0;
      }
      lVar11 = sVar8 << (bVar12 & 0x3f);
      pmVar15 = (tbinptr)pmVar15->prev_foot;
      do {
        pmVar14 = pmVar15;
        if ((pmVar14->head & 0xfffffffffffffff8) == sVar8) {
          if ((pmVar14 < _gm_.least_addr) || (pmVar17 = pmVar14->fd, pmVar17 < _gm_.least_addr))
          goto LAB_0010c0f9;
          pmVar15 = (tbinptr)&pmVar14->fd;
          pmVar17->bk = pmVar16;
          lVar11 = 0x30;
          m = (mstate)&DAT_00000010;
          pmVar18 = (tbinptr)0x0;
          goto LAB_0010bf8d;
        }
        lVar4 = lVar11 >> 0x3f;
        lVar11 = lVar11 * 2;
        pmVar15 = *(tbinptr *)((long)pmVar14 + lVar4 * -8 + 0x20);
      } while (pmVar15 != (tbinptr)0x0);
      pmVar15 = (tbinptr)((long)pmVar14 + lVar4 * -8 + 0x20);
      pmVar17 = pmVar14;
      if (pmVar15 < _gm_.least_addr) goto LAB_0010c0f9;
    }
    m = (mstate)&DAT_00000030;
    lVar11 = 0x10;
    pmVar14 = pmVar16;
    pmVar18 = pmVar16;
LAB_0010bf8d:
    pmVar15->prev_foot = (size_t)pmVar16;
    *(tbinptr *)((long)m->smallbins + (long)(pmVar16[-2].child + 3)) = pmVar17;
    pmVar16->bk = pmVar14;
    *(tbinptr *)((long)&pmVar16->prev_foot + lVar11) = pmVar18;
    _gm_.release_checks = _gm_.release_checks - 1;
    sVar8 = _gm_.dvsize;
    if (_gm_.release_checks == 0) {
      release_unused_segments(m);
      sVar8 = _gm_.dvsize;
    }
  }
LAB_0010c0d1:
  _gm_.dvsize = sVar8;
  if (((byte)_gm_.mflags & 2) != 0) {
    _gm_.mutex = 0;
  }
  return;
}

Assistant:

static void
Bfree(Bigint *v MTd)
{
#ifdef MULTIPLE_THREADS
	ThInfo *TI;
#endif
	if (v) {
		if (v->k > Kmax)
			FREE((void*)v);
		else {
#ifdef MULTIPLE_THREADS
			if (!(TI = *PTI))
				*PTI = TI = get_TI();
			if (TI == &TI0)
				ACQUIRE_DTOA_LOCK(0);
#endif
			v->next = freelist[v->k];
			freelist[v->k] = v;
#ifdef MULTIPLE_THREADS
			if (TI == &TI0)
				FREE_DTOA_LOCK(0);
#endif
			}
		}
	}